

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

bool __thiscall
SymbolTable::findEquation(SymbolTable *this,Identifier *name,int file,int section,size_t *dest)

{
  char *pcVar1;
  int *piVar2;
  iterator iVar3;
  bool bVar4;
  SymbolKey key;
  int local_48;
  int local_44;
  SymbolKey local_40;
  
  pcVar1 = (name->_name)._M_dataplus._M_p;
  if (*pcVar1 == '@') {
    piVar2 = &local_48;
    local_48 = section;
    if (pcVar1[1] == '@') {
      piVar2 = &local_44;
    }
  }
  else {
    local_48 = -1;
    piVar2 = &local_44;
  }
  local_44 = file;
  *piVar2 = -1;
  SymbolKey::SymbolKey(&local_40,name,local_44,local_48);
  iVar3 = std::
          _Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
          ::find((_Rb_tree<SymbolKey,_std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>,_std::_Select1st<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
                  *)this,&local_40);
  if (((_Rb_tree_header *)iVar3._M_node == &(this->symbols)._M_t._M_impl.super__Rb_tree_header) ||
     (*(int *)&iVar3._M_node[2]._M_parent != 1)) {
    bVar4 = false;
  }
  else {
    *dest = (size_t)iVar3._M_node[2]._M_left;
    bVar4 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.name._M_dataplus._M_p != &local_40.name.field_2) {
    operator_delete(local_40.name._M_dataplus._M_p,local_40.name.field_2._M_allocated_capacity + 1);
  }
  return bVar4;
}

Assistant:

bool SymbolTable::findEquation(const Identifier& name, int file, int section, size_t& dest)
{
	setFileSectionValues(name,file,section);
	
	SymbolKey key = { name, file, section };
	auto it = symbols.find(key);
	if (it == symbols.end() || it->second.type != EquationSymbol)
		return false;

	dest = it->second.index;
	return true;
}